

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O1

error<idx2::idx2_err_code> idx2::WriteBricks(brick_pool *Bp,cstr FileName)

{
  FILE *__s;
  undefined4 uVar1;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar2;
  brick_volume BrickVol;
  anon_union_12_8_3dedac88_for_v3<int>_1 local_98;
  int local_8c;
  grid local_88;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_70;
  int local_68;
  u64 local_48;
  u64 uStack_40;
  
  __s = fopen(FileName,"wb");
  if (__s == (FILE *)0x0) {
    *(char **)(*in_FS_OFFSET + -0xe80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2SparseBricks.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0xd3;
    uVar1 = 10;
  }
  else {
    local_70 = (Bp->Idx2->Dims3).field_0.field_3.XY.field_0;
    local_68 = (Bp->Idx2->Dims3).field_0.field_0.Z;
    fwrite(&local_70,0xc,1,__s);
    local_70 = (Bp->Idx2->BrickDims3).field_0.field_3.XY.field_0;
    local_68 = (Bp->Idx2->BrickDims3).field_0.field_0.Z;
    fwrite(&local_70,0xc,1,__s);
    local_70 = (Bp->Idx2->NBricks3).Arr[0].field_0.field_3.XY.field_0;
    local_68 = (Bp->Idx2->NBricks3).Arr[0].field_0.field_0.Z;
    fwrite(&local_70,0xc,1,__s);
    local_98.field_0.Z = 0;
    if (0 < (Bp->Idx2->NBricks3).Arr[0].field_0.field_0.Z) {
      do {
        uVar1 = local_98.field_0.Z;
        local_98.field_0.Y = 0;
        if (0 < (Bp->Idx2->NBricks3).Arr[0].field_0.field_0.Y) {
          do {
            local_98.field_0.X = 0;
            local_8c = local_98.field_0.Y;
            if (0 < (Bp->Idx2->NBricks3).Arr[0].field_0.field_0.X) {
              do {
                local_70.field_0.Y = local_98.field_0.Y;
                local_70.field_0.X = local_98.field_0.X;
                local_68 = uVar1;
                fwrite(&local_70,0xc,1,__s);
                GetBrickVolume((brick_volume *)&local_70.field_0,Bp,(v3i *)&local_98.field_0);
                local_88.super_extent.From =
                     (long)(uStack_40 << 0x16) >> 0xb & 0xffffffff00000000U |
                     (ulong)(uint)((long)(uStack_40 << 0x2b) >> 0x2b);
                local_88.super_extent.Dims =
                     CONCAT44(local_88.super_extent.Dims._4_4_,(int)((long)(uStack_40 * 2) >> 0x2b))
                ;
                fwrite(&local_88,0xc,1,__s);
                local_88.super_extent.From = local_48;
                local_88.super_extent.Dims = uStack_40;
                local_88.Strd = 0x40000200001;
                WriteVolume((FILE *)__s,(volume *)&local_70.field_0,&local_88);
                local_98.field_0.X = local_98.field_0.X + 1;
              } while (local_98.field_0.X < (Bp->Idx2->NBricks3).Arr[0].field_0.field_0.X);
            }
            local_98.field_0.Y = local_8c + 1;
          } while (local_98.field_0.Y < (Bp->Idx2->NBricks3).Arr[0].field_0.field_0.Y);
        }
        local_98.field_0.Z = uVar1 + 1;
      } while (local_98.field_0.Z < (Bp->Idx2->NBricks3).Arr[0].field_0.field_0.Z);
    }
    *(char **)(*in_FS_OFFSET + -0xe80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2SparseBricks.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0xe5;
    uVar1 = 0;
  }
  if (__s != (FILE *)0x0) {
    fclose(__s);
  }
  eVar2.Code = (char)uVar1;
  eVar2.StackIdx = (char)((uint)uVar1 >> 8);
  eVar2.StrGened = (bool)(char)((uint)uVar1 >> 0x10);
  eVar2._11_1_ = (char)((uint)uVar1 >> 0x18);
  eVar2.Msg = "";
  eVar2._12_4_ = 0;
  return eVar2;
}

Assistant:

error<idx2_err_code>
WriteBricks(brick_pool* Bp, cstr FileName)
{
  idx2_RAII(FILE*, Fp = fopen(FileName, "wb"), , if (Fp) fclose(Fp));
  if (!Fp)
    return idx2_Error(idx2_err_code::FileCreateFailed);

  WritePOD(Fp, Bp->Idx2->Dims3);
  WritePOD(Fp, Bp->Idx2->BrickDims3);
  WritePOD(Fp, Bp->Idx2->NBricks3[0]);

  v3i B3;
  idx2_BeginFor3 (B3, v3i(0), Bp->Idx2->NBricks3[0], v3i(1))
  {
    //u64 BrickIndex = GetLinearBrick(*Bp->Idx2, 0, B3);
    WritePOD(Fp, B3);
    brick_volume BrickVol = GetBrickVolume(Bp, B3);
    v3i D3 = Dims(BrickVol.ExtentLocal);
    WritePOD(Fp, Dims(BrickVol.ExtentLocal));
    v3i F3 = From(BrickVol.ExtentLocal);
    WriteVolume(Fp, BrickVol.Vol, grid(BrickVol.ExtentLocal));
  } idx2_EndFor3

  return idx2_Error(idx2_err_code::NoError);
}